

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

void dumpRnglistsSection(raw_ostream *OS,DWARFDataExtractor *rnglistData,
                        function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)>
                        LookupPooledAddress,DIDumpOptions DumpOpts)

{
  bool bVar1;
  raw_ostream *prVar2;
  uint64_t uVar3;
  Error *E;
  int local_14c;
  uint64_t Length;
  string local_138;
  char *local_108;
  size_t sStack_100;
  undefined8 local_f8;
  DWARFObject *pDStack_f0;
  DWARFSection *local_e8;
  undefined1 local_d8 [8];
  Error Err;
  uint64_t TableOffset;
  DWARFDebugRnglistTable Rnglists;
  uint64_t Offset;
  DWARFDataExtractor *rnglistData_local;
  raw_ostream *OS_local;
  function_ref<llvm::Optional<llvm::object::SectionedAddress>_(unsigned_int)>
  LookupPooledAddress_local;
  
  Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length = 0;
  do {
    bVar1 = llvm::DataExtractor::isValidOffset
                      (&rnglistData->super_DataExtractor,
                       Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.
                       Length);
    if (!bVar1) {
      return;
    }
    llvm::DWARFDebugRnglistTable::DWARFDebugRnglistTable((DWARFDebugRnglistTable *)&TableOffset);
    Err.Payload = (ErrorInfoBase *)
                  Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length;
    local_e8 = rnglistData->Section;
    local_108 = (rnglistData->super_DataExtractor).Data.Data;
    sStack_100 = (rnglistData->super_DataExtractor).Data.Length;
    local_f8._0_1_ = (rnglistData->super_DataExtractor).IsLittleEndian;
    local_f8._1_1_ = (rnglistData->super_DataExtractor).AddressSize;
    local_f8._2_6_ = *(undefined6 *)&(rnglistData->super_DataExtractor).field_0x12;
    pDStack_f0 = rnglistData->Obj;
    llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extract
              ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)local_d8,*rnglistData,&TableOffset);
    bVar1 = llvm::Error::operator_cast_to_bool((Error *)local_d8);
    if (bVar1) {
      prVar2 = llvm::WithColor::error();
      llvm::Error::Error((Error *)&Length,(Error *)local_d8);
      llvm::toString_abi_cxx11_(&local_138,(llvm *)&Length,E);
      prVar2 = llvm::raw_ostream::operator<<(prVar2,&local_138);
      llvm::raw_ostream::operator<<(prVar2,'\n');
      std::__cxx11::string::~string((string *)&local_138);
      llvm::Error::~Error((Error *)&Length);
      uVar3 = llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::length
                        ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)&TableOffset);
      if (uVar3 != 0) {
        Rnglists.super_DWARFListTableBase<llvm::DWARFDebugRnglist>.HeaderString.Length =
             (long)&(Err.Payload)->_vptr_ErrorInfoBase + uVar3;
        goto LAB_01fda7ca;
      }
      local_14c = 3;
    }
    else {
      llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::dump
                ((DWARFListTableBase<llvm::DWARFDebugRnglist> *)&TableOffset,OS,LookupPooledAddress,
                 DumpOpts);
LAB_01fda7ca:
      local_14c = 0;
    }
    llvm::Error::~Error((Error *)local_d8);
    if (local_14c == 0) {
      local_14c = 0;
    }
    llvm::DWARFDebugRnglistTable::~DWARFDebugRnglistTable((DWARFDebugRnglistTable *)&TableOffset);
    if (local_14c != 0) {
      return;
    }
  } while( true );
}

Assistant:

static void dumpRnglistsSection(
    raw_ostream &OS, DWARFDataExtractor &rnglistData,
    llvm::function_ref<Optional<object::SectionedAddress>(uint32_t)>
        LookupPooledAddress,
    DIDumpOptions DumpOpts) {
  uint64_t Offset = 0;
  while (rnglistData.isValidOffset(Offset)) {
    llvm::DWARFDebugRnglistTable Rnglists;
    uint64_t TableOffset = Offset;
    if (Error Err = Rnglists.extract(rnglistData, &Offset)) {
      WithColor::error() << toString(std::move(Err)) << '\n';
      uint64_t Length = Rnglists.length();
      // Keep going after an error, if we can, assuming that the length field
      // could be read. If it couldn't, stop reading the section.
      if (Length == 0)
        break;
      Offset = TableOffset + Length;
    } else {
      Rnglists.dump(OS, LookupPooledAddress, DumpOpts);
    }
  }
}